

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

string * __thiscall
spoa::Graph::GenerateConsensus_abi_cxx11_
          (string *__return_storage_ptr__,Graph *this,int32_t min_coverage,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *summary)

{
  pointer puVar1;
  pointer ppNVar2;
  pointer ppNVar3;
  uint32_t uVar4;
  invalid_argument *this_00;
  pointer ppNVar5;
  pointer ppNVar6;
  int local_3c;
  string *local_38;
  
  if (summary != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    puVar1 = (summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    local_38 = __return_storage_ptr__;
    GenerateConsensus_abi_cxx11_(__return_storage_ptr__,this,min_coverage);
    ppNVar2 = (this->consensus_).
              super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppNVar6 = (this->consensus_).
                   super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppNVar6 != ppNVar2;
        ppNVar6 = ppNVar6 + 1) {
      uVar4 = Node::Coverage(*ppNVar6);
      if (min_coverage <= (int)uVar4) {
        local_3c = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<int>
                  (summary,&local_3c);
        uVar4 = Node::Coverage(*ppNVar6);
        puVar1 = (summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish + -1;
        *puVar1 = *puVar1 + uVar4;
        ppNVar3 = ((*ppNVar6)->aligned_nodes).
                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppNVar5 = ((*ppNVar6)->aligned_nodes).
                       super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppNVar5 != ppNVar3;
            ppNVar5 = ppNVar5 + 1) {
          uVar4 = Node::Coverage(*ppNVar5);
          puVar1 = (summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish + -1;
          *puVar1 = *puVar1 + uVar4;
        }
      }
    }
    return local_38;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_00,"[spoa::Graph::GenerateConsensus] error: invalid ptr to summary");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::string Graph::GenerateConsensus(std::int32_t min_coverage,
                                     std::vector<std::uint32_t> *summary) {
  if (!summary) {
    throw std::invalid_argument(
        "[spoa::Graph::GenerateConsensus] error: invalid ptr to summary");
  }
  summary->clear();

  auto dst = GenerateConsensus(min_coverage);
  for (const auto &it : consensus_) {
    if (static_cast<std::int32_t>(it->Coverage()) >= min_coverage) {
      summary->emplace_back(0);
      summary->back() += it->Coverage();
      for (const auto &jt : it->aligned_nodes) {
        summary->back() += jt->Coverage();
      }
    }
  }

  return dst;
}